

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O0

void __thiscall
TypeTest_TestMaxArrayDepths_Test::~TypeTest_TestMaxArrayDepths_Test
          (TypeTest_TestMaxArrayDepths_Test *this)

{
  TypeTest_TestMaxArrayDepths_Test *this_local;
  
  ~TypeTest_TestMaxArrayDepths_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(TypeTest, TestMaxArrayDepths) {
  HeapType A;
  {
    TypeBuilder builder(1);
    builder[0] = Array(Field(Type::i32, Immutable));
    auto result = builder.build();
    ASSERT_TRUE(result);
    auto built = *result;
    A = built[0];
  }

  SubTypes subTypes({A});
  auto maxDepths = subTypes.getMaxDepths();

  EXPECT_EQ(maxDepths[A], Index(0));
  EXPECT_EQ(maxDepths[HeapType::array], Index(1));
  EXPECT_EQ(maxDepths[HeapType::eq], Index(2));
  EXPECT_EQ(maxDepths[HeapType::any], Index(3));
}